

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ApiPhraseNext(Fts5Context *pCtx,Fts5PhraseIter *pIter,int *piCol,int *piOff)

{
  uint uVar1;
  int iVar2;
  u32 uVar3;
  uchar *puVar4;
  long in_FS_OFFSET;
  int iVal;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = pIter->a;
  if (puVar4 < pIter->b) {
    local_3c = 0xaaaaaaaa;
    uVar1 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
    puVar4 = puVar4 + uVar1;
    pIter->a = puVar4;
    if (local_3c == 1) {
      iVar2 = *(int *)(*(long *)(*(long *)pCtx + 0x18) + 0x20);
      uVar1 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
      puVar4 = puVar4 + uVar1;
      pIter->a = puVar4;
      uVar3 = iVar2 - 1;
      if ((int)local_3c < iVar2) {
        uVar3 = local_3c;
      }
      *piCol = uVar3;
      *piOff = 0;
      uVar1 = sqlite3Fts5GetVarint32(puVar4,&local_3c);
      pIter->a = puVar4 + uVar1;
    }
    iVar2 = local_3c + *piOff + -2;
  }
  else {
    iVar2 = -1;
    *piCol = -1;
  }
  *piOff = iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts5ApiPhraseNext(
  Fts5Context *pCtx,
  Fts5PhraseIter *pIter,
  int *piCol, int *piOff
){
  if( pIter->a>=pIter->b ){
    *piCol = -1;
    *piOff = -1;
  }else{
    int iVal;
    pIter->a += fts5GetVarint32(pIter->a, iVal);
    if( iVal==1 ){
      /* Avoid returning a (*piCol) value that is too large for the table,
      ** even if the position-list is corrupt. The caller might not be
      ** expecting it.  */
      int nCol = ((Fts5Table*)(((Fts5Cursor*)pCtx)->base.pVtab))->pConfig->nCol;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
      *piCol = (iVal>=nCol ? nCol-1 : iVal);
      *piOff = 0;
      pIter->a += fts5GetVarint32(pIter->a, iVal);
    }
    *piOff += (iVal-2);
  }
}